

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

int sfd_listener_set_fd(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  int local_44;
  int rv;
  int fd;
  nni_aio *aio;
  sfd_listener *l;
  size_t sStack_28;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  aio = (nni_aio *)arg;
  l._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  arg_local._4_4_ = nni_copyin_int(&local_44,buf,sz,0,0x7fffffff,t);
  if (arg_local._4_4_ == 0) {
    nni_mtx_lock((nni_mtx *)aio->a_iov);
    if (((aio->a_task).task_cv.cv.__size[0x1c] & 1U) == 0) {
      if ((aio->a_task).task_mtx.mtx.__data.__lock == 0x10) {
        nni_mtx_unlock((nni_mtx *)aio->a_iov);
        arg_local._4_4_ = 0x16;
      }
      else {
        iVar1 = (aio->a_task).task_mtx.mtx.__data.__lock;
        (aio->a_task).task_mtx.mtx.__data.__lock = iVar1 + 1;
        *(int *)((long)aio->a_iov + (long)iVar1 * 4 + -0x5c) = local_44;
        _rv = (nni_aio *)nni_list_first((nni_list *)((long)&(aio->a_task).task_cv.cv + 0x20));
        if (_rv != (nni_aio *)0x0) {
          nni_aio_list_remove(_rv);
          sfd_start_conn((sfd_listener *)aio,_rv);
        }
        nni_mtx_unlock((nni_mtx *)aio->a_iov);
        arg_local._4_4_ = 0;
      }
    }
    else {
      nni_mtx_unlock((nni_mtx *)aio->a_iov);
      arg_local._4_4_ = 7;
    }
  }
  return arg_local._4_4_;
}

Assistant:

static int
sfd_listener_set_fd(void *arg, const void *buf, size_t sz, nni_type t)
{
	sfd_listener *l = arg;
	nni_aio      *aio;
	int           fd;
	int           rv;

	if ((rv = nni_copyin_int(&fd, buf, sz, 0, NNI_MAXINT, t)) != 0) {
		return (rv);
	}

	nni_mtx_lock(&l->mtx);
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}

	if (l->listen_cnt == NNG_SFD_LISTEN_QUEUE) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ENOSPC);
	}

	l->listen_q[l->listen_cnt++] = fd;

	// if someone was waiting in accept, give it to them now
	if ((aio = nni_list_first(&l->accept_q)) != NULL) {
		nni_aio_list_remove(aio);
		sfd_start_conn(l, aio);
	}

	nni_mtx_unlock(&l->mtx);
	return (0);
}